

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall
TeamCityTestOutput::printCurrentTestStarted(TeamCityTestOutput *this,UtestShell *test)

{
  ulong uVar1;
  long *in_RSI;
  long *in_RDI;
  UtestShell *in_stack_ffffffffffffff98;
  TeamCityTestOutput *this_00;
  undefined1 local_40 [48];
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testStarted name=\'");
  this_00 = (TeamCityTestOutput *)(local_40 + 0x20);
  UtestShell::getName(in_stack_ffffffffffffff98);
  SimpleString::asCharString((SimpleString *)0x114f96);
  printEscaped(this_00,(char *)in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x114fb8);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  uVar1 = (**(code **)(*local_10 + 0x30))();
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testIgnored name=\'");
    UtestShell::getName((UtestShell *)local_40);
    SimpleString::asCharString((SimpleString *)0x11500e);
    printEscaped(this_00,(char *)in_RDI);
    SimpleString::~SimpleString((SimpleString *)0x115030);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  }
  in_RDI[4] = (long)local_10;
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    print("##teamcity[testStarted name='");
    printEscaped(test.getName().asCharString());
    print("']\n");
    if (!test.willRun()) {
        print("##teamcity[testIgnored name='");
        printEscaped(test.getName().asCharString());
        print("']\n");
    }
    currtest_ = &test;
}